

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall
despot::util::tinyxml::TiXmlDocument::CopyTo(TiXmlDocument *this,TiXmlDocument *target)

{
  TiXmlNode *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  TiXmlNode **ppTVar3;
  
  TiXmlNode::CopyTo(&this->super_TiXmlNode,&target->super_TiXmlNode);
  target->error = this->error;
  target->errorId = this->errorId;
  TiXmlString::operator=(&target->errorDesc,&this->errorDesc);
  target->tabsize = this->tabsize;
  target->errorLocation = this->errorLocation;
  target->useMicrosoftBOM = this->useMicrosoftBOM;
  ppTVar3 = &(this->super_TiXmlNode).firstChild;
  while (pTVar1 = *ppTVar3, pTVar1 != (TiXmlNode *)0x0) {
    iVar2 = (*(pTVar1->super_TiXmlBase)._vptr_TiXmlBase[0x10])(pTVar1);
    TiXmlNode::LinkEndChild(&target->super_TiXmlNode,(TiXmlNode *)CONCAT44(extraout_var,iVar2));
    ppTVar3 = &pTVar1->next;
  }
  return;
}

Assistant:

void TiXmlDocument::CopyTo(TiXmlDocument* target) const {
	TiXmlNode::CopyTo(target);

	target->error = error;
	target->errorId = errorId;
	target->errorDesc = errorDesc;
	target->tabsize = tabsize;
	target->errorLocation = errorLocation;
	target->useMicrosoftBOM = useMicrosoftBOM;

	TiXmlNode* node = 0;
	for (node = firstChild; node; node = node->NextSibling()) {
		target->LinkEndChild(node->Clone());
	}
}